

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::closeHandle(CommonCore *this,InterfaceHandle handle)

{
  string_view message;
  bool bVar1;
  undefined8 uVar2;
  char *in_RDI;
  ActionMessage cmd;
  pair<helics::route_id,_helics::ActionMessage> *handleInfo;
  CommonCore *in_stack_fffffffffffffee8;
  ActionMessage *this_00;
  BrokerBase *in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  action_t in_stack_ffffffffffffff0c;
  ActionMessage *in_stack_ffffffffffffff10;
  GlobalHandle hand;
  ActionMessage local_e8;
  pair<helics::route_id,_helics::ActionMessage> *local_18;
  
  local_18 = getHandleInfo(in_stack_fffffffffffffee8,
                           (InterfaceHandle)(BaseType)((ulong)in_stack_fffffffffffffef0 >> 0x20));
  if (local_18 != (pair<helics::route_id,_helics::ActionMessage> *)0x0) {
    bVar1 = checkActionFlag<helics::BasicHandleInfo,helics::ConnectionFlags>
                      (local_18,disconnected_flag);
    if (!bVar1) {
      this_00 = &local_e8;
      ActionMessage::ActionMessage(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      hand.fed_id.gid = (local_18->first).rid;
      hand.handle.hid = *(BaseType *)&local_18->field_0x4;
      ActionMessage::setSource(this_00,hand);
      local_e8.messageID = (int32_t)(char)(local_18->second).messageID;
      BrokerBase::addActionMessage(in_stack_fffffffffffffef0,this_00);
      gmlc::libguarded::ordered_guarded<helics::HandleManager,std::shared_mutex>::
      modify<helics::CommonCore::closeHandle(helics::InterfaceHandle)::__0>
                ((ordered_guarded<helics::HandleManager,_std::shared_mutex> *)hand,
                 (anon_class_4_1_58265f66 *)
                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffef0);
    }
    return;
  }
  uVar2 = __cxa_allocate_exception(0x28);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),in_RDI);
  message._M_len._4_4_ = in_stack_ffffffffffffff0c;
  message._M_len._0_4_ = in_stack_ffffffffffffff08;
  message._M_str = (char *)in_stack_ffffffffffffff10;
  InvalidIdentifier::InvalidIdentifier
            ((InvalidIdentifier *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             message);
  __cxa_throw(uVar2,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
}

Assistant:

void CommonCore::closeHandle(InterfaceHandle handle)
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo == nullptr) {
        throw(InvalidIdentifier("invalid handle"));
    }
    if (checkActionFlag(*handleInfo, disconnected_flag)) {
        return;
    }
    ActionMessage cmd(CMD_CLOSE_INTERFACE);
    cmd.setSource(handleInfo->handle);
    cmd.messageID = static_cast<int32_t>(handleInfo->handleType);
    addActionMessage(cmd);
    handles.modify(
        [handle](auto& hand) { setActionFlag(*hand.getHandleInfo(handle), disconnected_flag); });
}